

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O3

asn_enc_rval_t *
OCTET_STRING_encode_xer
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,int ilevel,
          xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  int iVar9;
  byte *pbVar10;
  char *pcVar11;
  char scratch [52];
  char local_68 [56];
  
  if (sptr == (void *)0x0) {
LAB_00147b1e:
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
    return __return_storage_ptr__;
  }
  pbVar10 = *sptr;
  iVar1 = *(int *)((long)sptr + 8);
  if (pbVar10 == (byte *)0x0) {
    if (iVar1 != 0) goto LAB_00147b1e;
    sVar4 = 0;
    lVar6 = 0;
    if ((flags & XER_F_CANONICAL) == 0) goto LAB_00147be3;
  }
  else {
    pbVar3 = pbVar10 + iVar1;
    if ((flags & XER_F_CANONICAL) == 0) {
      sVar4 = 0;
      if (0 < iVar1) {
        iVar1 = 0;
        if (0 < ilevel) {
          iVar1 = ilevel;
        }
        pcVar7 = local_68;
        uVar5 = 0;
        do {
          pcVar11 = pcVar7;
          if (((uVar5 & 0xf) == 0) && ((uVar5 != 0 || (0x10 < *(int *)((long)sptr + 8))))) {
            sVar8 = (long)pcVar7 - (long)local_68;
            iVar9 = (*cb)(local_68,sVar8,app_key);
            if ((iVar9 < 0) || (iVar9 = (*cb)("\n",1,app_key), iVar9 < 0)) goto LAB_00147bf4;
            iVar9 = ilevel;
            if (0 < ilevel) {
              do {
                iVar2 = (*cb)("    ",4,app_key);
                if (iVar2 < 0) goto LAB_00147bf4;
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
            }
            sVar4 = sVar4 + sVar8 + (iVar1 * 4 + 1);
            pcVar11 = local_68;
          }
          *pcVar11 = "0123456789ABCDEF"[*pbVar10 >> 4];
          pcVar11[1] = "0123456789ABCDEF"[*pbVar10 & 0xf];
          pcVar7 = pcVar11 + 3;
          pcVar11[2] = ' ';
          pbVar10 = pbVar10 + 1;
          uVar5 = uVar5 + 1;
        } while (pbVar10 < pbVar3);
        if (pcVar7 == local_68) goto LAB_00147be3;
        iVar1 = (*cb)(local_68,(size_t)(pcVar11 + (2 - (long)local_68)),app_key);
        if (-1 < iVar1) {
          sVar4 = sVar4 + (long)(pcVar11 + (2 - (long)local_68));
          if (0x10 < *(int *)((long)sptr + 8)) {
            iVar1 = (*cb)("\n",1,app_key);
            if (iVar1 < 0) goto LAB_00147bf4;
            iVar1 = 1;
            if (1 < ilevel) {
              iVar1 = ilevel;
            }
            iVar9 = iVar1 + -1;
            if (1 < ilevel) {
              do {
                iVar2 = (*cb)("    ",4,app_key);
                if (iVar2 < 0) goto LAB_00147bf4;
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
            }
            sVar4 = sVar4 + (long)((iVar1 + -1) * 4 + 1);
          }
          goto LAB_00147be3;
        }
        goto LAB_00147bf4;
      }
      goto LAB_00147be3;
    }
    if (iVar1 < 1) {
      sVar4 = 0;
      lVar6 = 0;
    }
    else {
      lVar6 = 0;
      sVar4 = 0;
      do {
        if (0x31 < (long)sVar4) {
          iVar1 = (*cb)(local_68,sVar4,app_key);
          if (iVar1 < 0) goto LAB_00147bf4;
          lVar6 = lVar6 + sVar4;
          sVar4 = 0;
        }
        local_68[sVar4] = "0123456789ABCDEF"[*pbVar10 >> 4];
        local_68[sVar4 + 1] = "0123456789ABCDEF"[*pbVar10 & 0xf];
        sVar4 = sVar4 + 2;
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 < pbVar3);
    }
  }
  iVar1 = (*cb)(local_68,sVar4,app_key);
  if (iVar1 < 0) {
LAB_00147bf4:
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
    return __return_storage_ptr__;
  }
  sVar4 = sVar4 + lVar6;
LAB_00147be3:
  __return_storage_ptr__->encoded = sVar4;
  __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
  __return_storage_ptr__->structure_ptr = (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
OCTET_STRING_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const char * const h2c = "0123456789ABCDEF";
	const OCTET_STRING_t *st = (const OCTET_STRING_t *)sptr;
	asn_enc_rval_t er;
	char scratch[16 * 3 + 4];
	char *p = scratch;
	uint8_t *buf;
	uint8_t *end;
	size_t i;

	if(!st || (!st->buf && st->size))
		ASN__ENCODE_FAILED;

	er.encoded = 0;

	/*
	 * Dump the contents of the buffer in hexadecimal.
	 */
	buf = st->buf;
	end = buf + st->size;
	if(flags & XER_F_CANONICAL) {
		char *scend = scratch + (sizeof(scratch) - 2);
		for(; buf < end; buf++) {
			if(p >= scend) {
				ASN__CALLBACK(scratch, p - scratch);
				er.encoded += p - scratch;
				p = scratch;
			}
			*p++ = h2c[(*buf >> 4) & 0x0F];
			*p++ = h2c[*buf & 0x0F];
		}

		ASN__CALLBACK(scratch, p-scratch);	/* Dump the rest */
		er.encoded += p - scratch;
	} else {
		for(i = 0; buf < end; buf++, i++) {
			if(!(i % 16) && (i || st->size > 16)) {
				ASN__CALLBACK(scratch, p-scratch);
				er.encoded += (p-scratch);
				p = scratch;
				ASN__TEXT_INDENT(1, ilevel);
			}
			*p++ = h2c[(*buf >> 4) & 0x0F];
			*p++ = h2c[*buf & 0x0F];
			*p++ = 0x20;
		}
		if(p - scratch) {
			p--;	/* Remove the tail space */
			ASN__CALLBACK(scratch, p-scratch); /* Dump the rest */
			er.encoded += p - scratch;
			if(st->size > 16)
				ASN__TEXT_INDENT(1, ilevel-1);
		}
	}

	ASN__ENCODED_OK(er);
cb_failed:
	ASN__ENCODE_FAILED;
}